

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O1

void Ssw_ManPrintStats(Ssw_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Ssw_Pars_t *pSVar6;
  Aig_Man_t *pAVar7;
  uint uVar8;
  undefined8 in_RAX;
  int level;
  Ssw_Man_t *pSVar9;
  double dVar10;
  double dVar11;
  ulong uVar12;
  
  pSVar6 = p->pPars;
  uVar12 = CONCAT44((int)((ulong)in_RAX >> 0x20),pSVar6->nMaxLevs);
  pSVar9 = p;
  Abc_Print((int)p,
            "Parameters: F = %d. AddF = %d. C-lim = %d. Constr = %d. MaxLev = %d. Mem = %0.2f MB.\n"
            ,(double)p->nFrames * (double)p->pAig->vObjs->nSize * 24.0 * 9.5367431640625e-07,
            (ulong)(uint)pSVar6->nFramesK,(ulong)(uint)pSVar6->nFramesAddSim,
            (ulong)(uint)pSVar6->nBTLimit,(ulong)(uint)p->pAig->nConstrs,uVar12);
  pAVar7 = p->pAig;
  Abc_Print((int)pSVar9,"AIG       : PI = %d. PO = %d. Latch = %d. Node = %d.  Ave SAT vars = %d.\n"
            ,(ulong)(uint)pAVar7->nTruePis,(ulong)(uint)pAVar7->nTruePos,(ulong)(uint)pAVar7->nRegs,
            (ulong)(uint)(pAVar7->nObjs[6] + pAVar7->nObjs[5]),uVar12 & 0xffffffff00000000);
  uVar1 = p->nSatCallsSat;
  uVar2 = p->nSatProof;
  uVar3 = p->nSatFailsReal;
  pSVar9 = p;
  uVar8 = Ssw_ManCountEquivs(p);
  level = (int)pSVar9;
  Abc_Print(level,"SAT calls : Proof = %d. Cex = %d. Fail = %d. Lits proved = %d.\n",(ulong)uVar2,
            (ulong)uVar1,(ulong)uVar3,(ulong)uVar8);
  Abc_Print(level,"SAT solver: Vars max = %d. Calls max = %d. Recycles = %d. Sim rounds = %d.\n",
            (ulong)(uint)p->nVarsMax,(ulong)(uint)p->nCallsMax,(ulong)(uint)p->nRecyclesTotal,
            (ulong)(uint)p->nSimRounds);
  iVar4 = p->nNodesBeg;
  dVar11 = 1.0;
  dVar10 = 1.0;
  if (iVar4 != 0) {
    dVar10 = (double)iVar4;
  }
  iVar5 = p->nRegsBeg;
  if (iVar5 != 0) {
    dVar11 = (double)iVar5;
  }
  Abc_Print(level,
            "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
            ((double)(iVar4 - p->nNodesEnd) * 100.0) / dVar10,
            ((double)(iVar5 - p->nRegsEnd) * 100.0) / dVar11);
  p->timeOther = p->timeTotal -
                 (p->timeBmc + p->timeReduce + p->timeMarkCones + p->timeSimSat + p->timeSat);
  Abc_Print(level,"%s =","BMC        ");
  dVar10 = 0.0;
  if (p->timeTotal != 0) {
    dVar10 = ((double)p->timeBmc * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeBmc / 1000000.0,dVar10);
  Abc_Print(level,"%s =","Spec reduce");
  dVar10 = 0.0;
  if (p->timeTotal != 0) {
    dVar10 = ((double)p->timeReduce * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeReduce / 1000000.0,dVar10);
  Abc_Print(level,"%s =","Mark cones ");
  dVar10 = 0.0;
  if (p->timeTotal != 0) {
    dVar10 = ((double)p->timeMarkCones * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeMarkCones / 1000000.0,dVar10);
  Abc_Print(level,"%s =","Sim SAT    ");
  dVar10 = 0.0;
  if (p->timeTotal != 0) {
    dVar10 = ((double)p->timeSimSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSimSat / 1000000.0,dVar10);
  Abc_Print(level,"%s =","SAT solving");
  dVar10 = 0.0;
  if (p->timeTotal != 0) {
    dVar10 = ((double)p->timeSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSat / 1000000.0,dVar10);
  Abc_Print(level,"%s =","  unsat    ");
  dVar10 = 0.0;
  if (p->timeTotal != 0) {
    dVar10 = ((double)p->timeSatUnsat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUnsat / 1000000.0,dVar10);
  Abc_Print(level,"%s =","  sat      ");
  dVar10 = 0.0;
  if (p->timeTotal != 0) {
    dVar10 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatSat / 1000000.0,dVar10);
  Abc_Print(level,"%s =","  undecided");
  dVar10 = 0.0;
  if (p->timeTotal != 0) {
    dVar10 = ((double)p->timeSatUndec * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUndec / 1000000.0,dVar10);
  Abc_Print(level,"%s =","Other      ");
  dVar10 = 0.0;
  if (p->timeTotal != 0) {
    dVar10 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar10);
  Abc_Print(level,"%s =","TOTAL      ");
  dVar11 = (double)p->timeTotal;
  dVar10 = 0.0;
  if (p->timeTotal != 0) {
    dVar10 = (dVar11 * 100.0) / dVar11;
  }
  Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar11 / 1000000.0,dVar10);
  if (p->pAig->nConstrs != 0) {
    Abc_Print(level,"Statistics reflecting the use of constraints:\n");
    Abc_Print(level,"Total cones  = %6d.  Constraint cones = %6d. (%6.2f %%)\n",
              ((double)p->nConesConstr * 100.0) / (double)p->nConesTotal);
    Abc_Print(level,"Total equivs = %6d.  Removed equivs   = %6d. (%6.2f %%)\n",
              ((double)p->nEquivsConstr * 100.0) / (double)p->nEquivsTotal);
    iVar4 = p->nNodesBegC;
    dVar11 = 1.0;
    dVar10 = 1.0;
    if (iVar4 != 0) {
      dVar10 = (double)iVar4;
    }
    iVar5 = p->nRegsBegC;
    if (iVar5 != 0) {
      dVar11 = (double)iVar5;
    }
    Abc_Print(level,
              "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
              ,((double)(iVar4 - p->nNodesEndC) * 100.0) / dVar10,
              ((double)(iVar5 - p->nRegsEndC) * 100.0) / dVar11);
    return;
  }
  return;
}

Assistant:

void Ssw_ManPrintStats( Ssw_Man_t * p )
{
    double nMemory = 1.0*Aig_ManObjNumMax(p->pAig)*p->nFrames*(2*sizeof(int)+2*sizeof(void*))/(1<<20);

    Abc_Print( 1, "Parameters: F = %d. AddF = %d. C-lim = %d. Constr = %d. MaxLev = %d. Mem = %0.2f MB.\n",
        p->pPars->nFramesK, p->pPars->nFramesAddSim, p->pPars->nBTLimit, Saig_ManConstrNum(p->pAig), p->pPars->nMaxLevs, nMemory );
    Abc_Print( 1, "AIG       : PI = %d. PO = %d. Latch = %d. Node = %d.  Ave SAT vars = %d.\n",
        Saig_ManPiNum(p->pAig), Saig_ManPoNum(p->pAig), Saig_ManRegNum(p->pAig), Aig_ManNodeNum(p->pAig),
        0/(p->pPars->nIters+1) );
    Abc_Print( 1, "SAT calls : Proof = %d. Cex = %d. Fail = %d. Lits proved = %d.\n",
        p->nSatProof, p->nSatCallsSat, p->nSatFailsReal, Ssw_ManCountEquivs(p) );
    Abc_Print( 1, "SAT solver: Vars max = %d. Calls max = %d. Recycles = %d. Sim rounds = %d.\n",
        p->nVarsMax, p->nCallsMax, p->nRecyclesTotal, p->nSimRounds );
    Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
        p->nNodesBeg, p->nNodesEnd, 100.0*(p->nNodesBeg-p->nNodesEnd)/(p->nNodesBeg?p->nNodesBeg:1),
        p->nRegsBeg, p->nRegsEnd, 100.0*(p->nRegsBeg-p->nRegsEnd)/(p->nRegsBeg?p->nRegsBeg:1) );

    p->timeOther = p->timeTotal-p->timeBmc-p->timeReduce-p->timeMarkCones-p->timeSimSat-p->timeSat;
    ABC_PRTP( "BMC        ", p->timeBmc,       p->timeTotal );
    ABC_PRTP( "Spec reduce", p->timeReduce,    p->timeTotal );
    ABC_PRTP( "Mark cones ", p->timeMarkCones, p->timeTotal );
    ABC_PRTP( "Sim SAT    ", p->timeSimSat,    p->timeTotal );
    ABC_PRTP( "SAT solving", p->timeSat,       p->timeTotal );
    ABC_PRTP( "  unsat    ", p->timeSatUnsat,  p->timeTotal );
    ABC_PRTP( "  sat      ", p->timeSatSat,    p->timeTotal );
    ABC_PRTP( "  undecided", p->timeSatUndec,  p->timeTotal );
    ABC_PRTP( "Other      ", p->timeOther,     p->timeTotal );
    ABC_PRTP( "TOTAL      ", p->timeTotal,     p->timeTotal );

    // report the reductions
    if ( p->pAig->nConstrs )
    {
        Abc_Print( 1, "Statistics reflecting the use of constraints:\n" );
        Abc_Print( 1, "Total cones  = %6d.  Constraint cones = %6d. (%6.2f %%)\n",
            p->nConesTotal, p->nConesConstr, 100.0*p->nConesConstr/p->nConesTotal );
        Abc_Print( 1, "Total equivs = %6d.  Removed equivs   = %6d. (%6.2f %%)\n",
            p->nEquivsTotal, p->nEquivsConstr, 100.0*p->nEquivsConstr/p->nEquivsTotal );
        Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n",
            p->nNodesBegC, p->nNodesEndC, 100.0*(p->nNodesBegC-p->nNodesEndC)/(p->nNodesBegC?p->nNodesBegC:1),
            p->nRegsBegC, p->nRegsEndC,   100.0*(p->nRegsBegC-p->nRegsEndC)/(p->nRegsBegC?p->nRegsBegC:1) );
    }
}